

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int mbedtls_cipher_reset(mbedtls_cipher_context_t *ctx)

{
  mbedtls_cipher_context_t *ctx_local;
  
  if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
    ctx_local._4_4_ = -0x6100;
  }
  else {
    ctx->unprocessed_len = 0;
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_reset(mbedtls_cipher_context_t *ctx)
{
    if (ctx->cipher_info == NULL) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

#if defined(MBEDTLS_USE_PSA_CRYPTO) && !defined(MBEDTLS_DEPRECATED_REMOVED)
    if (ctx->psa_enabled == 1) {
        /* We don't support resetting PSA-based
         * cipher contexts, yet. */
        return MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE;
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO && !MBEDTLS_DEPRECATED_REMOVED */

    ctx->unprocessed_len = 0;

    return 0;
}